

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

void __thiscall
cfd::TransactionContext::SignWithPrivkeySimple
          (TransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,Amount *value,AddressType address_type,bool has_grind_r)

{
  WitnessVersion WVar1;
  ByteData signature;
  ByteData sighash;
  SignParameter sign;
  ByteData256 local_f0;
  SigHashType local_d8 [12];
  SigHashType local_cc [12];
  ByteData local_c0;
  SignParameter local_a8;
  
  WVar1 = TransactionContextUtil::CheckSignWithPrivkeySimple(outpoint,pubkey,privkey,address_type);
  cfd::core::SigHashType::SigHashType(local_cc,sighash_type);
  (**(code **)(*(long *)this + 0x98))(&local_c0,this,outpoint,pubkey,local_cc,value,WVar1);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_a8,&local_c0);
  cfd::core::SignatureUtil::CalculateEcSignature(&local_f0,(Privkey *)&local_a8,SUB81(privkey,0));
  if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::SigHashType::SigHashType(local_d8,sighash_type);
  SignParameter::SignParameter(&local_a8,(ByteData *)&local_f0,true,local_d8);
  AddPubkeyHashSign(this,outpoint,&local_a8,pubkey,address_type);
  local_a8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b2f30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.op_code_.text_data_._M_dataplus._M_p != &local_a8.op_code_.text_data_.field_2) {
    operator_delete(local_a8.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_a8.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TransactionContext::SignWithPrivkeySimple(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, const Amount& value, AddressType address_type,
    bool has_grind_r) {
  WitnessVersion version = TransactionContextUtil::CheckSignWithPrivkeySimple(
      outpoint, pubkey, privkey, address_type);

  ByteData sighash =
      CreateSignatureHash(outpoint, pubkey, sighash_type, value, version);
  ByteData signature = SignatureUtil::CalculateEcSignature(
      ByteData256(sighash), privkey, has_grind_r);
  SignParameter sign(signature, true, sighash_type);

  AddPubkeyHashSign(outpoint, sign, pubkey, address_type);
}